

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O0

void __thiscall duckdb::TransactionInfo::Serialize(TransactionInfo *this,Serializer *serializer)

{
  ParseInfo *in_RSI;
  Serializer *in_RDI;
  Serializer *unaff_retaddr;
  Serializer *pSVar1;
  field_id_t field_id;
  
  pSVar1 = in_RDI;
  ParseInfo::Serialize(in_RSI,in_RDI);
  field_id = (field_id_t)((ulong)pSVar1 >> 0x30);
  Serializer::WriteProperty<duckdb::TransactionType>
            (unaff_retaddr,field_id,(char *)in_RSI,(TransactionType *)in_RDI);
  Serializer::WriteProperty<duckdb::TransactionModifierType>
            (unaff_retaddr,field_id,(char *)in_RSI,(TransactionModifierType *)in_RDI);
  return;
}

Assistant:

void TransactionInfo::Serialize(Serializer &serializer) const {
	ParseInfo::Serialize(serializer);
	serializer.WriteProperty<TransactionType>(200, "type", type);
	serializer.WriteProperty<TransactionModifierType>(201, "modifier", modifier);
}